

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O1

int __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::remove
          (SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs> *this,char *__filename)

{
  Node ****ppppNVar1;
  TermList **ppTVar2;
  uint uVar3;
  IntermediateNode *pIVar4;
  uint64_t uVar5;
  TermList *pTVar6;
  TermList *pTVar7;
  undefined8 uVar8;
  Node ***pppNVar9;
  Node ***pppNVar10;
  Node *pNVar11;
  Node ***pppNVar12;
  TermList TVar13;
  Self SVar14;
  int iVar15;
  int extraout_EAX;
  Entry *pEVar16;
  Node **inode;
  ulong uVar17;
  undefined8 *in_RDX;
  ulong uVar18;
  Node *node;
  Top TVar19;
  Stack<Kernel::TermList_*> subterms;
  TermList t;
  Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  history;
  Stack<Kernel::TermList_*> local_d0;
  TermList local_b0;
  Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_a8;
  undefined8 *local_98;
  SelectedSummand local_90;
  Lhs local_60;
  undefined4 extraout_var;
  
  inode = &this->_root;
  local_98 = in_RDX;
  ::Lib::
  Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_a8);
  while (iVar15 = (*(((IntermediateNode *)*inode)->super_Node)._vptr_Node[2])(),
        SVar14._M_t.
        super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
        .
        super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>,_true,_true>
                )local_a8._self, (char)iVar15 == '\0') {
    if (*(Node ****)
         ((long)local_a8._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
                .
                super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_false>
                ._M_head_impl + 0x10) ==
        *(Node ****)
         ((long)local_a8._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
                .
                super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_false>
                ._M_head_impl + 0x18)) {
      ::Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
      ::expand((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
                *)local_a8._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
                  .
                  super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_false>
                  ._M_head_impl);
    }
    **(Node ****)
      ((long)SVar14._M_t.
             super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_false>
             ._M_head_impl + 0x10) = inode;
    ppppNVar1 = (Node ****)
                ((long)SVar14._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_false>
                       ._M_head_impl + 0x10);
    *ppppNVar1 = *ppppNVar1 + 1;
    pIVar4 = (IntermediateNode *)*inode;
    local_d0._capacity = CONCAT44(local_d0._capacity._4_4_,pIVar4->childVar);
    pEVar16 = ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
              findEntry((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
                         *)__filename,(uint *)&local_d0);
    local_b0._content = (pEVar16->_val)._content;
    TVar19 = Kernel::TermList::top(&local_b0);
    iVar15 = (*(pIVar4->super_Node)._vptr_Node[10])
                       (pIVar4,TVar19._inner._inner._0_8_,(ulong)(TVar19._inner._inner._8_4_ & 0xff)
                        ,0);
    inode = (Node **)CONCAT44(extraout_var,iVar15);
    uVar5 = (((IntermediateNode *)*inode)->super_Node)._term._content;
    if (uVar5 != local_b0._content) {
      uVar3 = *(uint *)(uVar5 + 0xc);
      local_d0._capacity = 0x78;
      local_d0._stack = (TermList **)::operator_new(0x3c0,0x10);
      local_d0._end = local_d0._stack + local_d0._capacity;
      local_d0._cursor = local_d0._stack;
      if (local_d0._capacity == 0) {
        ::Lib::Stack<Kernel::TermList_*>::expand(&local_d0);
      }
      TVar13._content = local_b0._content;
      *local_d0._cursor = (TermList *)((ulong)(uVar3 & 0xfffffff) * 8 + 0x28 + uVar5);
      local_d0._cursor = local_d0._cursor + 1;
      uVar3 = *(uint *)(local_b0._content + 0xc);
      if (local_d0._cursor == local_d0._end) {
        ::Lib::Stack<Kernel::TermList_*>::expand(&local_d0);
      }
      *local_d0._cursor = (TermList *)(TVar13._content + (ulong)(uVar3 & 0xfffffff) * 8 + 0x28);
      local_d0._cursor = local_d0._cursor + 1;
      while (local_d0._cursor != local_d0._stack) {
        pTVar6 = local_d0._cursor[-1];
        ppTVar2 = local_d0._cursor + -2;
        pTVar7 = local_d0._cursor[-2];
        local_d0._cursor = ppTVar2;
        if ((pTVar6[-1]._content & 3) != 2) {
          if (ppTVar2 == local_d0._end) {
            ::Lib::Stack<Kernel::TermList_*>::expand(&local_d0);
          }
          *local_d0._cursor = pTVar7 + -1;
          local_d0._cursor = local_d0._cursor + 1;
          if (local_d0._cursor == local_d0._end) {
            ::Lib::Stack<Kernel::TermList_*>::expand(&local_d0);
          }
          *local_d0._cursor = pTVar6 + -1;
          local_d0._cursor = local_d0._cursor + 1;
        }
        uVar17 = pTVar7->_content;
        if (uVar17 != pTVar6->_content) {
          if ((uVar17 & 1) == 0) {
            uVar18 = (ulong)(*(uint *)(uVar17 + 0xc) & 0xfffffff);
            if ((*(uint *)(uVar17 + 0x28 + uVar18 * 8) & 3) != 2) {
              if (local_d0._cursor == local_d0._end) {
                ::Lib::Stack<Kernel::TermList_*>::expand(&local_d0);
              }
              *local_d0._cursor = (TermList *)(uVar18 * 8 + 0x28 + uVar17);
              local_d0._cursor = local_d0._cursor + 1;
              uVar5 = pTVar6->_content;
              uVar3 = *(uint *)(uVar5 + 0xc);
              if (local_d0._cursor == local_d0._end) {
                ::Lib::Stack<Kernel::TermList_*>::expand(&local_d0);
              }
              *local_d0._cursor = (TermList *)(uVar5 + (ulong)(uVar3 & 0xfffffff) * 8 + 0x28);
              local_d0._cursor = local_d0._cursor + 1;
            }
          }
          else {
            ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::set
                      ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *
                       )__filename,(uint)(uVar17 >> 2),(TermList)pTVar6->_content);
          }
        }
      }
      if (local_d0._stack != (TermList **)0x0) {
        uVar17 = local_d0._capacity * 8 + 0xf & 0xfffffffffffffff0;
        if (uVar17 == 0) {
          *local_d0._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_d0._stack;
        }
        else if (uVar17 < 0x11) {
          *local_d0._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_d0._stack;
        }
        else if (uVar17 < 0x19) {
          *local_d0._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_d0._stack;
        }
        else if (uVar17 < 0x21) {
          *local_d0._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_d0._stack;
        }
        else if (uVar17 < 0x31) {
          *local_d0._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_d0._stack;
        }
        else if (uVar17 < 0x41) {
          *local_d0._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_d0._stack;
        }
        else {
          operator_delete(local_d0._stack,0x10);
        }
      }
    }
  }
  pIVar4 = (IntermediateNode *)*inode;
  local_90.super_SelectedLiteral.litIdx = *(uint *)(local_98 + 1);
  local_90.super_SelectedLiteral.cl = (Clause *)*local_98;
  local_90.super_SelectedLiteral.interpreted.
  super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ._isSome = *(bool *)((long)local_98 + 0xc);
  if (local_90.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._isSome == true) {
    local_90.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._21_7_ = 0;
    local_90.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._0_5_ = *(uint5 *)(local_98 + 2) & 0xffffffff03;
    local_90.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._5_3_ = 0;
    uVar8 = *(undefined8 *)((long)local_98 + 0x19);
    local_90.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._9_3_ = (undefined3)uVar8;
    local_90.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._8_4_ =
         (uint)(uint3)local_90.super_SelectedLiteral.interpreted.
                      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      ._elem._elem._9_3_ << 8;
    local_90.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._12_4_ = (undefined4)((ulong)uVar8 >> 0x18);
    local_90.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem.init._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[0xf] = (char)((ulong)uVar8 >> 0x38);
    local_90.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem._17_3_ = (undefined3)*(undefined4 *)((long)local_98 + 0x21);
    local_90.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._elem._elem.init._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[0x13] = (char)((uint)*(undefined4 *)((long)local_98 + 0x21) >> 0x18);
  }
  local_90.super_SelectedLiteral._44_4_ = *(undefined4 *)((long)local_98 + 0x2c);
  Inferences::ALASCA::FourierMotzkinConf::Lhs::Lhs(&local_60,&local_90);
  (*(pIVar4->super_Node)._vptr_Node[10])(pIVar4,&local_60);
  ensureLeafEfficiency((Leaf **)inode);
  do {
    iVar15 = (*(((IntermediateNode *)*inode)->super_Node)._vptr_Node[3])();
    if ((char)iVar15 == '\0') break;
    pIVar4 = (IntermediateNode *)*inode;
    local_d0._capacity = (pIVar4->super_Node)._term._content;
    pppNVar9 = *(Node ****)
                ((long)local_a8._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_false>
                       ._M_head_impl + 8);
    pppNVar10 = *(Node ****)
                 ((long)local_a8._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
                        .
                        super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_false>
                        ._M_head_impl + 0x10);
    if (pppNVar10 == pppNVar9) {
      if (pIVar4 != (IntermediateNode *)0x0) {
        (*(pIVar4->super_Node)._vptr_Node[1])(pIVar4);
      }
      *inode = (Node *)0x0;
    }
    else {
      pNVar11 = *pppNVar10[-1];
      TVar19 = Kernel::TermList::top((TermList *)&local_d0);
      (*pNVar11->_vptr_Node[0xb])
                (pNVar11,TVar19._inner._inner._0_8_,(ulong)(TVar19._inner._inner._8_4_ & 0xff));
      if (pIVar4 != (IntermediateNode *)0x0) {
        (*(pIVar4->super_Node)._vptr_Node[1])(pIVar4);
      }
      pppNVar12 = *(Node ****)
                   ((long)local_a8._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
                          .
                          super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_false>
                          ._M_head_impl + 0x10);
      *(Node ****)
       ((long)local_a8._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>_>
              .
              super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_*,_false>
              ._M_head_impl + 0x10) = pppNVar12 + -1;
      inode = pppNVar12[-1];
      ensureIntermediateNodeEfficiency((IntermediateNode **)inode);
    }
  } while (pppNVar10 != pppNVar9);
  ::Lib::
  Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_a8);
  return extraout_EAX;
}

Assistant:

void SubstitutionTree<LeafData_>::remove(BindingMap& svBindings, LeafData ld)
{
  ASS_EQ(_iterCnt,0);
  auto pnode = &_root;
  DEBUG_REMOVE(0, "remove: ", svBindings, " from ", *this)

  ASS(*pnode);

  Recycled<Stack<Node**>> history;

  while (! (*pnode)->isLeaf()) {
    history->push(pnode);

    IntermediateNode* inode=static_cast<IntermediateNode*>(*pnode);

    unsigned boundVar=inode->childVar;
    TermList t = svBindings.get(boundVar);

    pnode=inode->childByTop(t.top(),false);
    ASS(pnode);


    TermList* s = &(*pnode)->term();
    ASS(TermList::sameTop(*s,t));

    if(*s==t) {
      continue;
    }

    ASS(! s->isVar());
    TermList* ss = s->term()->args();
    ASS(!ss->isEmpty());

    // computing the disagreement set of the two terms
    Stack<TermList*> subterms(120);

    subterms.push(ss);
    subterms.push(t.term()->args());
    while (! subterms.isEmpty()) {
      TermList* tt = subterms.pop();
      ss = subterms.pop();
      if (tt->next()->isEmpty()) {
	ASS(ss->next()->isEmpty());
      }
      else {
	subterms.push(ss->next());
	subterms.push(tt->next());
      }
      if (*ss==*tt) {
	continue;
      }
      if (ss->isVar()) {
	ASS(ss->isSpecialVar());
	svBindings.set(ss->var(),*tt);
	continue;
      }
      ASS(! tt->isVar());
      ASS(ss->term()->functor() == tt->term()->functor());
      ss = ss->term()->args();
      if (! ss->isEmpty()) {
	ASS(! tt->term()->args()->isEmpty());
	subterms.push(ss);
	subterms.push(tt->term()->args());
      }
    }
  }

  ASS ((*pnode)->isLeaf());


  Leaf* lnode = static_cast<Leaf*>(*pnode);
  lnode->remove(ld);
  ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));

  while( (*pnode)->isEmpty() ) {
    TermList term=(*pnode)->term();
    if(history->isEmpty()) {
      delete *pnode;
      *pnode=0;
      DEBUG_REMOVE(0, "out: ", *this);
      return;
    } else {
      Node* node=*pnode;
      IntermediateNode* parent=static_cast<IntermediateNode*>(*history->top());
      parent->remove(term.top());
      delete node;
      pnode = history->pop();
      ensureIntermediateNodeEfficiency(reinterpret_cast<IntermediateNode**>(pnode));
    }
  }
  DEBUG_REMOVE(0, "out: ", *this);
}